

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Asn1.cpp
# Opt level: O3

String * axl::cry::getAsn1StringString(String *__return_storage_ptr__,ASN1_STRING *string)

{
  BIO_METHOD *method;
  BUF_MEM *pBVar1;
  Bio bio;
  Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_> local_18;
  
  local_18.m_h = (bio_st *)0x0;
  method = BIO_s_mem();
  Bio::create((Bio *)&local_18,(BIO_METHOD *)method);
  ASN1_STRING_print((BIO *)local_18.m_h,(ASN1_STRING *)string);
  pBVar1 = Bio::getBufMem((Bio *)&local_18);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (__return_storage_ptr__,pBVar1->data,pBVar1->length);
  sl::Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>::~Handle(&local_18);
  return __return_storage_ptr__;
}

Assistant:

sl::String
getAsn1StringString(const ASN1_STRING* string) {
	Bio bio;
	bio.createMem();
	ASN1_STRING_print(bio, string);

	BUF_MEM* mem = bio.getBufMem();
	return sl::String(mem->data, mem->length);
}